

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall rlib::JsonT<void>::JsonT(JsonT<void> *this,JsonT<void> *s)

{
  undefined4 *in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
  *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  *(undefined4 *)&(in_RDI->_M_t)._M_impl = *in_RSI;
  switch(*(undefined4 *)&(in_RDI->_M_t)._M_impl) {
  case 0:
    break;
  case 1:
    *(undefined1 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
         *(undefined1 *)(in_RSI + 2) & _S_black;
    break;
  case 2:
    *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header =
         *(undefined8 *)(in_RSI + 2);
    break;
  case 3:
    *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header =
         *(undefined8 *)(in_RSI + 2);
    break;
  case 4:
    std::__cxx11::string::string
              ((string *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,(string *)(in_RSI + 2));
    break;
  case 5:
    std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::vector
              ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)in_RDI,
               (vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
               in_stack_ffffffffffffffd8);
    break;
  case 6:
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
    ::map(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

JsonT(JsonT&& s)
			:m_type(s.m_type)
		{
			switch (m_type) {
			case Type::Null:																break;
			case Type::Bool:	m_bool = s.m_bool;											break;
			case Type::Float:	m_float = s.m_float;										break;
			case Type::Int:		m_int = s.m_int;											break;
			case Type::String:	new(&m_string) decltype(m_string)(std::move(s.m_string));	break;
			case Type::Array:	new(&m_array) decltype(m_array)(std::move(s.m_array));		break;
			case Type::Map:		new(&m_map) decltype(m_map)(std::move(s.m_map));			break;
			default:			assert(false);
			}
		}